

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void FM::OPNABase::BuildLFOTable(void)

{
  uint local_10;
  int local_c;
  int v;
  int c;
  
  if (amtable == -1) {
    for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
      *(int *)(pmtable + (long)local_c * 4) = local_c;
      if (local_c < 0x80) {
        local_10 = local_c * -2 + 0xff;
      }
      else {
        local_10 = (local_c + -0x80) * 2;
      }
      (&amtable)[local_c] = local_10 & 0xfffffffc;
    }
  }
  return;
}

Assistant:

void OPNABase::BuildLFOTable()
{
	if (amtable[0] == -1)
	{
		for (int c=0; c<256; c++)
		{
			int v;
			if (c < 0x40)		v = c * 2 + 0x80;
			else if (c < 0xc0)	v = 0x7f - (c - 0x40) * 2 + 0x80;
			else				v = (c - 0xc0) * 2;
			pmtable[c] = c;

			if (c < 0x80)		v = 0xff - c * 2;
			else				v = (c - 0x80) * 2;
			amtable[c] = v & ~3;
		}
	}
}